

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O0

void __thiscall
sqvector<SQVM::CallInfo,_unsigned_int>::resize
          (sqvector<SQVM::CallInfo,_unsigned_int> *this,size_type newsize,CallInfo *fill)

{
  undefined8 in_RDX;
  SQObjectType in_ESI;
  CallInfo *in_RDI;
  size_type i;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_fffffffffffffff0;
  SQObjectType SVar1;
  
  if (*(SQObjectType *)&(in_RDI->_closure).super_SQObject._flags < in_ESI) {
    _realloc((sqvector<SQVM::CallInfo,_unsigned_int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (size_type)((ulong)in_RDX >> 0x20));
  }
  SVar1 = in_ESI;
  if ((in_RDI->_closure).super_SQObject._type < in_ESI) {
    while ((in_RDI->_closure).super_SQObject._type < in_ESI) {
      SQVM::CallInfo::CallInfo
                ((CallInfo *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
      (in_RDI->_closure).super_SQObject._type = (in_RDI->_closure).super_SQObject._type + 1;
    }
  }
  else {
    for (; in_ESI < (in_RDI->_closure).super_SQObject._type; in_ESI = in_ESI + 1) {
      SQVM::CallInfo::~CallInfo((CallInfo *)0x16ca75);
    }
    (in_RDI->_closure).super_SQObject._type = SVar1;
  }
  return;
}

Assistant:

void resize(size_type newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(size_type i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }